

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::getEDDHPublicKey
          (SoftHSM *this,EDPublicKey *publicKey,EDPrivateKey *privateKey,ByteString *pubData)

{
  CK_RV CVar1;
  SoftHSM *this_00;
  ByteString data;
  ByteString local_40;
  
  CVar1 = 7;
  if (privateKey != (EDPrivateKey *)0x0 && publicKey != (EDPublicKey *)0x0) {
    this_00 = (SoftHSM *)(**(code **)(*(long *)privateKey + 0x60))(privateKey);
    (**(code **)(*(long *)publicKey + 0x38))(publicKey);
    getECDHPubData(&local_40,this_00,pubData);
    (**(code **)(*(long *)publicKey + 0x40))(publicKey,&local_40);
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    CVar1 = 0;
  }
  return CVar1;
}

Assistant:

CK_RV SoftHSM::getEDDHPublicKey(EDPublicKey* publicKey, EDPrivateKey* privateKey, ByteString& pubData)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (privateKey == NULL) return CKR_ARGUMENTS_BAD;

	// Copy Domain Parameters from Private Key
	publicKey->setEC(privateKey->getEC());

	// Set value
	ByteString data = getECDHPubData(pubData);
	publicKey->setA(data);

	return CKR_OK;
}